

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateInternalForwardDeclarations
          (FileGenerator *this,CrossFileReferences *refs,Printer *printer)

{
  pointer *this_00;
  bool bVar1;
  reference ppDVar2;
  reference ppFVar3;
  Options *in_RCX;
  Options *options;
  string local_1f8;
  cpp *local_1d8;
  FileDescriptor *file;
  iterator __end3_1;
  iterator __begin3_1;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *__range3_1;
  string local_180;
  undefined1 local_160 [64];
  undefined1 local_120 [64];
  string local_e0;
  cpp *local_c0;
  Descriptor *instance;
  iterator __end3;
  iterator __begin3;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  *__range3;
  undefined1 local_78 [8];
  NamespaceOpener ns;
  Formatter format;
  Printer *printer_local;
  CrossFileReferences *refs_local;
  FileGenerator *this_local;
  
  this_00 = &ns.name_stack_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  Formatter::Formatter((Formatter *)this_00,printer,&this->variables_);
  NamespaceOpener::NamespaceOpener((NamespaceOpener *)local_78,(Formatter *)this_00);
  anon_unknown_20::Sorted<google::protobuf::Descriptor>
            ((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              *)&__begin3,&refs->weak_default_instances);
  __end3 = std::
           vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
           ::begin((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    *)&__begin3);
  instance = (Descriptor *)
             std::
             vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
             ::end((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    *)&__begin3);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_google::protobuf::Descriptor_**,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
                                *)&instance);
    if (!bVar1) break;
    ppDVar2 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::Descriptor_**,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
              ::operator*(&__end3);
    local_c0 = (cpp *)*ppDVar2;
    Namespace_abi_cxx11_(&local_e0,local_c0,(Descriptor *)&this->options_,in_RCX);
    NamespaceOpener::ChangeTo((NamespaceOpener *)local_78,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    if (((this->options_).lite_implicit_weak_fields & 1U) == 0) {
      DefaultInstanceType_abi_cxx11_(&local_180,local_c0,(Descriptor *)&this->options_,in_RCX);
      DefaultInstanceName_abi_cxx11_
                ((string *)&__range3_1,local_c0,(Descriptor *)&this->options_,in_RCX);
      in_RCX = (Options *)&__range3_1;
      Formatter::operator()
                ((Formatter *)
                 &ns.name_stack_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 "extern __attribute__((weak)) $1$ $2$;\n",&local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX);
      std::__cxx11::string::~string((string *)&__range3_1);
      std::__cxx11::string::~string((string *)&local_180);
    }
    else {
      DefaultInstanceType_abi_cxx11_
                ((string *)(local_120 + 0x20),local_c0,(Descriptor *)&this->options_,in_RCX);
      DefaultInstanceName_abi_cxx11_
                ((string *)local_120,local_c0,(Descriptor *)&this->options_,in_RCX);
      options = (Options *)local_120;
      Formatter::operator()
                ((Formatter *)
                 &ns.name_stack_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"extern $1$ $2$;\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_120 + 0x20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)options);
      std::__cxx11::string::~string((string *)local_120);
      std::__cxx11::string::~string((string *)(local_120 + 0x20));
      DefaultInstanceType_abi_cxx11_
                ((string *)(local_160 + 0x20),local_c0,(Descriptor *)&this->options_,options);
      DefaultInstancePtr_abi_cxx11_
                ((string *)local_160,local_c0,(Descriptor *)&this->options_,options);
      in_RCX = (Options *)local_160;
      Formatter::operator()
                ((Formatter *)
                 &ns.name_stack_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 "__attribute__((weak)) $1$* $2$ = nullptr;\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_160 + 0x20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX);
      std::__cxx11::string::~string((string *)local_160);
      std::__cxx11::string::~string((string *)(local_160 + 0x20));
    }
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::Descriptor_**,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
    ::operator++(&__end3);
  }
  std::
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~vector((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
             *)&__begin3);
  NamespaceOpener::~NamespaceOpener((NamespaceOpener *)local_78);
  anon_unknown_20::Sorted<google::protobuf::FileDescriptor>
            ((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              *)&__begin3_1,&refs->weak_reflection_files);
  __end3_1 = std::
             vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ::begin((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      *)&__begin3_1);
  file = (FileDescriptor *)
         std::
         vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
         ::end((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)&__begin3_1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3_1,
                       (__normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                        *)&file);
    if (!bVar1) break;
    ppFVar3 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
              ::operator*(&__end3_1);
    local_1d8 = (cpp *)*ppFVar3;
    DescriptorTableName_abi_cxx11_(&local_1f8,local_1d8,(FileDescriptor *)&this->options_,in_RCX);
    Formatter::operator()
              ((Formatter *)
               &ns.name_stack_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "extern __attribute__((weak)) const ::$proto_ns$::internal::DescriptorTable $1$;\n",
               &local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
    ::operator++(&__end3_1);
  }
  std::
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             *)&__begin3_1);
  Formatter::~Formatter
            ((Formatter *)
             &ns.name_stack_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void FileGenerator::GenerateInternalForwardDeclarations(
    const CrossFileReferences& refs, io::Printer* printer) {
  Formatter format(printer, variables_);

  {
    NamespaceOpener ns(format);
    for (auto instance : Sorted(refs.weak_default_instances)) {
      ns.ChangeTo(Namespace(instance, options_));
      if (options_.lite_implicit_weak_fields) {
        format("extern $1$ $2$;\n", DefaultInstanceType(instance, options_),
               DefaultInstanceName(instance, options_));
        format("__attribute__((weak)) $1$* $2$ = nullptr;\n",
               DefaultInstanceType(instance, options_),
               DefaultInstancePtr(instance, options_));
      } else {
        format("extern __attribute__((weak)) $1$ $2$;\n",
               DefaultInstanceType(instance, options_),
               DefaultInstanceName(instance, options_));
      }
    }
  }

  for (auto file : Sorted(refs.weak_reflection_files)) {
    format(
        "extern __attribute__((weak)) const "
        "::$proto_ns$::internal::DescriptorTable $1$;\n",
        DescriptorTableName(file, options_));
  }
}